

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLhandler.c
# Opt level: O3

void RDL_giveEdges(uint a,uint b,char *array,RDL_graph *gra,RDL_sPathInfo *spi,char *visited)

{
  uint to;
  uint uVar1;
  RDL_graph *pRVar2;
  ulong uVar3;
  
  if (a != b) {
    visited[b] = '\x01';
    pRVar2 = spi->dPaths[a];
    if (pRVar2->degree[b] != 0) {
      uVar3 = 0;
      do {
        to = pRVar2->adjList[b][uVar3][0];
        uVar1 = RDL_edgeId(gra,b,to);
        array[uVar1] = '\x01';
        if (visited[to] == '\0') {
          RDL_giveEdges(a,to,array,gra,spi,visited);
        }
        uVar3 = uVar3 + 1;
        pRVar2 = spi->dPaths[a];
      } while (uVar3 < pRVar2->degree[b]);
    }
  }
  return;
}

Assistant:

void RDL_giveEdges(unsigned a, unsigned b, char *array,
    const RDL_graph *gra, const RDL_sPathInfo *spi, char* visited)
{
/* similar to the function "List_Paths" from Vismara*/
  unsigned i, vertex, edge;

  if(a==b) {
    return;
  }

  visited[b] = 1;

  /*for each vertex adjacent to b in U_a*/
  for(i=0; i<spi->dPaths[a]->degree[b]; ++i)
  {
    vertex = spi->dPaths[a]->adjList[b][i][0];
    edge = RDL_edgeId(gra,b,vertex);
    array[edge] = 1;
    if (!visited[vertex]) {
      RDL_giveEdges(a, vertex, array, gra, spi, visited);
    }
  }
}